

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.hpp
# Opt level: O0

SmallIntegerValue Lodtalk::moduleRoundNeg(SmallIntegerValue dividend,SmallIntegerValue divisor)

{
  long local_20;
  SmallIntegerValue result;
  SmallIntegerValue divisor_local;
  SmallIntegerValue dividend_local;
  
  if (divisor == 0) {
    __assert_fail("divisor != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Math.hpp"
                  ,0x2e,
                  "SmallIntegerValue Lodtalk::moduleRoundNeg(SmallIntegerValue, SmallIntegerValue)")
    ;
  }
  local_20 = dividend % divisor;
  if (divisor < 0) {
    if (0 < local_20) {
      local_20 = divisor + local_20;
    }
  }
  else if (local_20 < 0) {
    local_20 = divisor + local_20;
  }
  return local_20;
}

Assistant:

inline SmallIntegerValue moduleRoundNeg(SmallIntegerValue dividend, SmallIntegerValue divisor)
{
    // This algorithm was taken from the Squeak VM.
    assert(divisor != 0);

    auto result = dividend % divisor;

    // Make sure the result has the same sign as the divisor.
    if (divisor < 0)
    {
        if (result > 0)
            result += divisor;
    }
    else
    {
        if (result < 0)
            result += divisor;
    }

    return result;
}